

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# partiallock.cc
# Opt level: O3

int plock_unlock(plock *plock,plock_entry_t *plock_entry)

{
  int iVar1;
  plock_node *node;
  
  iVar1 = -1;
  if (plock_entry != (plock_entry_t *)0x0 && plock != (plock *)0x0) {
    (*plock->ops->lock_internal)(plock->lock);
    if (plock_entry->wcount == 0) {
      list_remove(&plock->active,&plock_entry->le);
      list_push_front(&plock->inactive,&plock_entry->le);
    }
    (*plock->ops->unlock_user)(plock_entry->lock);
    (*plock->ops->unlock_internal)(plock->lock);
    iVar1 = 0;
  }
  return iVar1;
}

Assistant:

int plock_unlock(struct plock *plock, plock_entry_t *plock_entry)
{
    struct plock_node *node = plock_entry;

    if (!plock || !plock_entry) {
        return PLOCK_RESULT_INVALID_ARGS;
    }

    // grab plock's lock
    plock->ops->lock_internal(plock->lock);

    if (node->wcount == 0) {
        // no other thread refers this node
        // move from active to inactive
        list_remove(&plock->active, &node->le);
        list_push_front(&plock->inactive, &node->le);
    }
    plock->ops->unlock_user(node->lock);

    // release plock's lock
    plock->ops->unlock_internal(plock->lock);

    return PLOCK_RESULT_SUCCESS;
}